

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O0

void __thiscall
glslang::TOutputTraverser::visitConstantUnion(TOutputTraverser *this,TIntermConstantUnion *node)

{
  TInfoSink *out;
  TConstUnionArray *constUnion;
  TIntermConstantUnion *node_local;
  TOutputTraverser *this_local;
  
  OutputTreeText(this->infoSink,(TIntermNode *)node,(this->super_TIntermTraverser).depth);
  TInfoSinkBase::operator<<(&this->infoSink->debug,"Constant:\n");
  out = this->infoSink;
  constUnion = TIntermConstantUnion::getConstArray(node);
  OutputConstantUnion(out,&node->super_TIntermTyped,constUnion,this->extraOutput,
                      (this->super_TIntermTraverser).depth + 1);
  return;
}

Assistant:

void TOutputTraverser::visitConstantUnion(TIntermConstantUnion* node)
{
    OutputTreeText(infoSink, node, depth);
    infoSink.debug << "Constant:\n";

    OutputConstantUnion(infoSink, node, node->getConstArray(), extraOutput, depth + 1);
}